

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmLocalNinjaGenerator.cxx
# Opt level: O0

string * __thiscall
cmLocalNinjaGenerator::GetTargetDirectory_abi_cxx11_
          (string *__return_storage_ptr__,cmLocalNinjaGenerator *this,cmTarget *target)

{
  char *pcVar1;
  string *psVar2;
  allocator local_22;
  undefined1 local_21;
  cmTarget *local_20;
  cmTarget *target_local;
  cmLocalNinjaGenerator *this_local;
  string *dir;
  
  local_21 = 0;
  local_20 = target;
  target_local = (cmTarget *)this;
  this_local = (cmLocalNinjaGenerator *)__return_storage_ptr__;
  pcVar1 = cmake::GetCMakeFilesDirectoryPostSlash();
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)__return_storage_ptr__,pcVar1,&local_22);
  std::allocator<char>::~allocator((allocator<char> *)&local_22);
  psVar2 = cmTarget::GetName_abi_cxx11_(local_20);
  std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)psVar2);
  std::__cxx11::string::operator+=((string *)__return_storage_ptr__,".dir");
  return __return_storage_ptr__;
}

Assistant:

std::string cmLocalNinjaGenerator
::GetTargetDirectory(cmTarget const& target) const
{
  std::string dir = cmake::GetCMakeFilesDirectoryPostSlash();
  dir += target.GetName();
#if defined(__VMS)
  dir += "_dir";
#else
  dir += ".dir";
#endif
  return dir;
}